

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_uncompressed.cpp
# Opt level: O1

idx_t duckdb::FixedSizeAppend<unsigned_long,duckdb::ListFixedSizeAppend>
                (CompressionAppendState *append_state,ColumnSegment *segment,
                SegmentStatistics *stats,UnifiedVectorFormat *data,idx_t offset,idx_t count)

{
  atomic<unsigned_long> *paVar1;
  data_ptr_t pdVar2;
  __int_type _Var3;
  data_ptr_t pdVar4;
  sel_t *psVar5;
  idx_t iVar6;
  ulong uVar7;
  ulong uVar8;
  uint64_t *tdata;
  
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(append_state->handle).node);
  pdVar2 = ((append_state->handle).node.ptr)->buffer;
  iVar6 = ColumnSegment::SegmentSize(segment);
  uVar7 = (iVar6 >> 3) -
          (segment->super_SegmentBase<duckdb::ColumnSegment>).count.
          super___atomic_base<unsigned_long>._M_i;
  if (count < uVar7) {
    uVar7 = count;
  }
  _Var3 = (segment->super_SegmentBase<duckdb::ColumnSegment>).count.
          super___atomic_base<unsigned_long>._M_i;
  if (uVar7 != 0) {
    pdVar4 = data->data;
    psVar5 = data->sel->sel_vector;
    iVar6 = 0;
    do {
      if (psVar5 == (sel_t *)0x0) {
        uVar8 = offset + iVar6;
      }
      else {
        uVar8 = (ulong)psVar5[offset + iVar6];
      }
      *(undefined8 *)(pdVar2 + iVar6 * 8 + _Var3 * 8) = *(undefined8 *)(pdVar4 + uVar8 * 8);
      iVar6 = iVar6 + 1;
    } while (uVar7 != iVar6);
  }
  LOCK();
  paVar1 = &(segment->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + uVar7;
  UNLOCK();
  return uVar7;
}

Assistant:

idx_t FixedSizeAppend(CompressionAppendState &append_state, ColumnSegment &segment, SegmentStatistics &stats,
                      UnifiedVectorFormat &data, idx_t offset, idx_t count) {
	D_ASSERT(segment.GetBlockOffset() == 0);

	auto target_ptr = append_state.handle.Ptr();
	idx_t max_tuple_count = segment.SegmentSize() / sizeof(T);
	idx_t copy_count = MinValue<idx_t>(count, max_tuple_count - segment.count);

	OP::template Append<T>(stats, target_ptr, segment.count, data, offset, copy_count);
	segment.count += copy_count;
	return copy_count;
}